

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O0

Qiniu_Error
Qiniu_RS_BatchStat(Qiniu_Client *self,Qiniu_RS_BatchStatRet *rets,Qiniu_RS_EntryPath *entries,
                  Qiniu_ItemCount entryCount)

{
  char *body_00;
  Qiniu_RS_BatchStatRet *self_00;
  char *pcVar1;
  size_t bodyLen;
  Qiniu_Int64 QVar2;
  Qiniu_Error QVar3;
  undefined4 uStack_b4;
  char *url;
  char *local_90;
  char *rsHost;
  Qiniu_ItemCount retSize;
  Qiniu_ItemCount curr;
  Qiniu_RS_EntryPath *entry;
  char *opBody;
  char *entryURIEncoded;
  char *entryURI;
  char *bodyTmp;
  char *body;
  cJSON *dataItem;
  cJSON *arrayItem;
  cJSON *root;
  int code;
  Qiniu_ItemCount entryCount_local;
  Qiniu_RS_EntryPath *entries_local;
  Qiniu_RS_BatchStatRet *rets_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  bodyTmp = (char *)0x0;
  entryURI = (char *)0x0;
  rsHost._4_4_ = 0;
  rsHost._0_4_ = 0;
  _retSize = entries;
  root._4_4_ = entryCount;
  _code = entries;
  entries_local = (Qiniu_RS_EntryPath *)rets;
  rets_local = (Qiniu_RS_BatchStatRet *)self;
  QVar3 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_90);
  err._0_8_ = QVar3.message;
  self_local = (Qiniu_Client *)CONCAT44(url._4_4_,QVar3.code);
  if (QVar3.code == 200) {
    pcVar1 = Qiniu_String_Concat2(local_90,"/batch");
    while (self_00 = rets_local, body_00 = bodyTmp, rsHost._4_4_ < root._4_4_) {
      entryURIEncoded = Qiniu_String_Concat3(_retSize->bucket,":",_retSize->key);
      opBody = Qiniu_String_Encode(entryURIEncoded);
      entry = (Qiniu_RS_EntryPath *)Qiniu_String_Concat2("op=/stat/",opBody);
      free(entryURIEncoded);
      free(opBody);
      if (bodyTmp == (char *)0x0) {
        entryURI = (char *)entry;
      }
      else {
        entryURI = Qiniu_String_Concat3(bodyTmp,"&",(char *)entry);
        free(entry);
      }
      free(bodyTmp);
      bodyTmp = entryURI;
      rsHost._4_4_ = rsHost._4_4_ + 1;
      _retSize = _code + rsHost._4_4_;
    }
    bodyLen = strlen(bodyTmp);
    QVar3 = Qiniu_Client_CallWithBuffer
                      ((Qiniu_Client *)self_00,&arrayItem,pcVar1,body_00,bodyLen,
                       "application/x-www-form-urlencoded");
    err._0_8_ = QVar3.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_b4,QVar3.code);
    free(pcVar1);
    free(bodyTmp);
    rsHost._0_4_ = cJSON_GetArraySize(arrayItem);
    for (rsHost._4_4_ = 0; rsHost._4_4_ < (int)rsHost; rsHost._4_4_ = rsHost._4_4_ + 1) {
      dataItem = cJSON_GetArrayItem(arrayItem,rsHost._4_4_);
      QVar2 = Qiniu_Json_GetInt64(dataItem,"code",0);
      root._0_4_ = (int)QVar2;
      body = (char *)cJSON_GetObjectItem(dataItem,"data");
      *(int *)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 0x30) = (int)root;
      if ((int)root == 200) {
        pcVar1 = Qiniu_Json_GetString((Qiniu_Json *)body,"hash",(char *)0x0);
        *(char **)((long)entries_local + (long)rsHost._4_4_ * 0x38) = pcVar1;
        pcVar1 = Qiniu_Json_GetString((Qiniu_Json *)body,"mimeType",(char *)0x0);
        *(char **)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 8) = pcVar1;
        QVar2 = Qiniu_Json_GetInt64((Qiniu_Json *)body,"fsize",0);
        *(Qiniu_Int64 *)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 0x10) = QVar2;
        QVar2 = Qiniu_Json_GetInt64((Qiniu_Json *)body,"putTime",0);
        *(Qiniu_Int64 *)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 0x18) = QVar2;
        QVar2 = Qiniu_Json_GetInt64((Qiniu_Json *)body,"type",0);
        *(Qiniu_Int64 *)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 0x20) = QVar2;
      }
      else {
        pcVar1 = Qiniu_Json_GetString((Qiniu_Json *)body,"error",(char *)0x0);
        *(char **)((long)entries_local + (long)rsHost._4_4_ * 0x38 + 0x28) = pcVar1;
      }
    }
  }
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchStat(
    Qiniu_Client *self, Qiniu_RS_BatchStatRet *rets,
    Qiniu_RS_EntryPath *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *opBody;
    Qiniu_RS_EntryPath *entry = entries;
    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);
        opBody = Qiniu_String_Concat2("op=/stat/", entryURIEncoded);
        free(entryURI);
        free(entryURIEncoded);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        else
        {
            rets[curr].data.hash = Qiniu_Json_GetString(dataItem, "hash", 0);
            rets[curr].data.mimeType = Qiniu_Json_GetString(dataItem, "mimeType", 0);
            rets[curr].data.fsize = Qiniu_Json_GetInt64(dataItem, "fsize", 0);
            rets[curr].data.putTime = Qiniu_Json_GetInt64(dataItem, "putTime", 0);
            rets[curr].data.type = Qiniu_Json_GetInt64(dataItem, "type", 0);
        }
        curr++;
    }

    return err;
}